

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QLayoutItem_*>::QList(QList<QLayoutItem_*> *this,qsizetype size,parameter_type t)

{
  QArrayDataPointer<QLayoutItem_*>::QArrayDataPointer(&this->d,size,0,KeepSize);
  if (size != 0) {
    QtPrivate::QPodArrayOps<QLayoutItem_*>::copyAppend((QPodArrayOps<QLayoutItem_*> *)this,size,t);
    return;
  }
  return;
}

Assistant:

QList(qsizetype size, parameter_type t)
        : d(size)
    {
        if (size)
            d->copyAppend(size, t);
    }